

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O0

void sqlcheck::CheckSpaghettiQuery(Configuration *state,string *sql_statement,bool *print_statement)

{
  PatternType pattern_type_00;
  char *pcVar1;
  allocator local_109;
  string local_108;
  string local_e8;
  char *local_c8;
  char *message;
  size_t spaghetti_query_char_count;
  PatternType pattern_type;
  string title;
  regex pattern;
  undefined1 local_60 [8];
  regex false_pattern;
  regex true_pattern;
  bool *print_statement_local;
  string *sql_statement_local;
  Configuration *state_local;
  
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             &false_pattern._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,".+?",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_60,
             "pattern must not exist",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)((long)&title.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&pattern_type,"Spaghetti Query Alert",
             (allocator *)((long)&spaghetti_query_char_count + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&spaghetti_query_char_count + 7));
  spaghetti_query_char_count._0_4_ = PATTERN_TYPE_QUERY;
  message = (char *)0x1f4;
  pcVar1 = (char *)std::__cxx11::string::size();
  if (pcVar1 < message) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::operator=
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)((long)&title.field_2 + 8),
               (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_60);
  }
  else {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::operator=
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)((long)&title.field_2 + 8),
               (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
               &false_pattern._M_automaton.
                super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  pattern_type_00 = (PatternType)spaghetti_query_char_count;
  local_c8 = anon_var_dwarf_9050b;
  std::__cxx11::string::string((string *)&local_e8,(string *)&pattern_type);
  pcVar1 = local_c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_108,pcVar1,&local_109);
  CheckPattern(state,sql_statement,print_statement,(regex *)((long)&title.field_2 + 8),
               RISK_LEVEL_LOW,pattern_type_00,&local_e8,&local_108,true,0);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&pattern_type);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)((long)&title.field_2 + 8));
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_60);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             &false_pattern._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void CheckSpaghettiQuery(Configuration& state,
                         const std::string& sql_statement,
                         bool& print_statement){

  std::regex true_pattern(".+?");
  std::regex false_pattern("pattern must not exist");
  std::regex pattern;

  std::string title = "Spaghetti Query Alert";
  PatternType pattern_type = PatternType::PATTERN_TYPE_QUERY;
  std::size_t spaghetti_query_char_count = 500;

  if(sql_statement.size() >= spaghetti_query_char_count){
    pattern = true_pattern;
  }
  else {
    pattern = false_pattern;
  }

  auto message =
      "● Split up a complex spaghetti query into several simpler queries:  "
      "SQL is a very expressive language—you can accomplish a lot in a single query or statement. "
      "But that doesn't mean it's mandatory or even a good idea to approach every task with the "
      "assumption it has to be done in one line of code. "
      "One common unintended consequence of producing all your results in one query is "
      "a Cartesian product. This happens when two of the tables in the query have no condition "
      "restricting their relationship. Without such a restriction, the join of two tables pairs "
      "each row in the first table to every row in the other table. Each such pairing becomes a "
      "row of the result set, and you end up with many more rows than you expect. "
      "It's important to consider that these queries are simply hard to write, hard to modify, "
      "and hard to debug. You should expect to get regular requests for incremental enhancements "
      "to your database applications. Managers want more complex reports and more fields in a "
      "user interface. If you design intricate, monolithic SQL queries, it's more costly and "
      "time-consuming to make enhancements to them. Your time is worth something, both to you "
      "and to your project. "
      "Split up a complex spaghetti query into several simpler queries. "
      "When you split up a complex SQL query, the result may be many similar queries, "
      "perhaps varying slightly depending on data values. Writing these queries is a chore, "
      "so it's a good application of SQL code generation. "
      "Although SQL makes it seem possible to solve a complex problem in a single line of code, "
      "don't be tempted to build a house of cards.";

  CheckPattern(state,
               sql_statement,
               print_statement,
               pattern,
               RISK_LEVEL_LOW,
               pattern_type,
               title,
               message,
               true);

}